

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O3

ssize_t __thiscall SimpleLogger::LogElem::write(LogElem *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  size_t __n_00;
  undefined4 in_register_00000034;
  bool bVar2;
  
  LOCK();
  bVar2 = (this->status)._M_i == CLEAN;
  if (bVar2) {
    (this->status)._M_i = WRITING;
  }
  UNLOCK();
  sVar1 = 0xffffffff;
  if (bVar2) {
    __n_00 = 0x1000;
    if (CONCAT44(in_register_00000034,__fd) < 0x1000) {
      __n_00 = CONCAT44(in_register_00000034,__fd);
    }
    this->len = __n_00;
    memcpy(this->ctx,__buf,__n_00);
    LOCK();
    (this->status)._M_i = DIRTY;
    UNLOCK();
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

int SimpleLogger::LogElem::write(size_t _len, char* msg) {
    Status exp = CLEAN;
    Status val = WRITING;
    if (!status.compare_exchange_strong(exp, val)) return -1;

    len = (_len > MSG_SIZE) ? MSG_SIZE : _len;
    memcpy(ctx, msg, len);

    status.store(LogElem::DIRTY);
    return 0;
}